

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFontGlyphRangesBuilder::AddRanges(ImFontGlyphRangesBuilder *this,ImWchar *ranges)

{
  uint *puVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  uint uVar5;
  
  uVar2 = *ranges;
  do {
    uVar5 = (uint)uVar2;
    if (uVar2 == 0) {
      return;
    }
    uVar3 = ranges[1];
    if (uVar2 <= uVar3) {
      lVar4 = *(long *)(this + 8);
      do {
        uVar5 = uVar5 & 0xffff;
        if (*(int *)this <= (int)(uVar5 >> 5)) {
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                        ,0x4e6,"T &ImVector<unsigned int>::operator[](int) [T = unsigned int]");
        }
        puVar1 = (uint *)(lVar4 + (ulong)(uVar5 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)uVar5 & 0x1f);
        uVar5 = uVar5 + 1;
      } while ((ushort)uVar5 <= uVar3);
    }
    uVar2 = ranges[2];
    ranges = ranges + 2;
  } while( true );
}

Assistant:

void ImFontGlyphRangesBuilder::AddRanges(const ImWchar* ranges)
{
    for (; ranges[0]; ranges += 2)
        for (ImWchar c = ranges[0]; c <= ranges[1]; c++)
            AddChar(c);
}